

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O0

int Fxu_FastExtract(Fxu_Data_t *pData)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  int Counter;
  int Weight3;
  int Weight2;
  int Weight1;
  Fxu_Double *pDouble;
  Fxu_Single *pSingle;
  Fxu_Matrix *p;
  Fxu_Data_t *pFStack_18;
  int fScrollLines;
  Fxu_Data_t *pData_local;
  
  p._4_4_ = 0;
  uVar7 = 0;
  s_MemoryTotal = 0;
  s_MemoryPeak = 0;
  pFStack_18 = pData;
  pSingle = (Fxu_Single *)Fxu_CreateMatrix(pData);
  if ((Fxu_Matrix *)pSingle == (Fxu_Matrix *)0x0) {
    pData_local._4_4_ = -1;
  }
  else {
    if (pFStack_18->fOnlyS == 0) {
      if (pFStack_18->fOnlyD == 0) {
        if (pFStack_18->fUseCompl == 0) {
          pFStack_18->nNodesNew = 0;
          do {
            uVar1 = Fxu_HeapSingleReadMaxWeight((Fxu_HeapSingle *)pSingle[2].pVar1);
            uVar3 = Fxu_HeapDoubleReadMaxWeight((Fxu_HeapDouble *)pSingle[1].pPrev);
            if (pFStack_18->fVerbose != 0) {
              uVar6 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              pcVar5 = "\r";
              if (p._4_4_ != 0) {
                pcVar5 = "\n";
              }
              printf("Div %5d : Best double = %5d. Best single = %5d.%s",uVar6,(ulong)uVar3,
                     (ulong)uVar1,pcVar5);
            }
            if ((int)uVar1 < (int)uVar3) {
              if (((int)uVar3 <= pFStack_18->WeightMin) &&
                 ((uVar3 != 0 || (pFStack_18->fUse0 == 0)))) break;
              Fxu_UpdateDouble((Fxu_Matrix *)pSingle);
            }
            else {
              if (((int)uVar1 <= pFStack_18->WeightMin) &&
                 ((uVar1 != 0 || (pFStack_18->fUse0 == 0)))) break;
              Fxu_UpdateSingle((Fxu_Matrix *)pSingle);
            }
            iVar2 = pFStack_18->nNodesNew + 1;
            pFStack_18->nNodesNew = iVar2;
          } while (iVar2 < pFStack_18->nNodesExt);
        }
        else {
          pFStack_18->nNodesNew = 0;
          do {
            uVar1 = Fxu_HeapSingleReadMaxWeight((Fxu_HeapSingle *)pSingle[2].pVar1);
            uVar3 = Fxu_HeapDoubleReadMaxWeight((Fxu_HeapDouble *)pSingle[1].pPrev);
            uVar4 = Fxu_Select((Fxu_Matrix *)pSingle,(Fxu_Single **)&pDouble,(Fxu_Double **)&Weight2
                              );
            if (pFStack_18->fVerbose != 0) {
              uVar6 = (ulong)uVar7;
              uVar7 = uVar7 + 1;
              pcVar5 = "\r";
              if (p._4_4_ != 0) {
                pcVar5 = "\n";
              }
              printf("Div %5d : Best double = %5d. Best single = %5d. Best complement = %5d.%s",
                     uVar6,(ulong)uVar3,(ulong)uVar1,(ulong)uVar4,pcVar5,uVar7);
            }
            if (((int)uVar4 <= pFStack_18->WeightMin) && ((uVar4 != 0 || (pFStack_18->fUse0 == 0))))
            break;
            Fxu_Update((Fxu_Matrix *)pSingle,(Fxu_Single *)pDouble,_Weight2);
            iVar2 = pFStack_18->nNodesNew + 1;
            pFStack_18->nNodesNew = iVar2;
          } while (iVar2 < pFStack_18->nNodesExt);
        }
      }
      else {
        pFStack_18->nNodesNew = 0;
        do {
          uVar1 = Fxu_HeapDoubleReadMaxWeight((Fxu_HeapDouble *)pSingle[1].pPrev);
          if (pFStack_18->fVerbose != 0) {
            uVar6 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            pcVar5 = "\r";
            if (p._4_4_ != 0) {
              pcVar5 = "\n";
            }
            printf("Div %5d : Best double = %5d.%s",uVar6,(ulong)uVar1,pcVar5);
          }
          if (((int)uVar1 <= pFStack_18->WeightMin) && ((uVar1 != 0 || (pFStack_18->fUse0 == 0))))
          break;
          Fxu_UpdateDouble((Fxu_Matrix *)pSingle);
          iVar2 = pFStack_18->nNodesNew + 1;
          pFStack_18->nNodesNew = iVar2;
        } while (iVar2 < pFStack_18->nNodesExt);
      }
    }
    else {
      pFStack_18->nNodesNew = 0;
      do {
        uVar1 = Fxu_HeapSingleReadMaxWeight((Fxu_HeapSingle *)pSingle[2].pVar1);
        if (pFStack_18->fVerbose != 0) {
          uVar6 = (ulong)uVar7;
          uVar7 = uVar7 + 1;
          pcVar5 = "\r";
          if (p._4_4_ != 0) {
            pcVar5 = "\n";
          }
          printf("Div %5d : Best single = %5d.%s",uVar6,(ulong)uVar1,pcVar5);
        }
        if (((int)uVar1 <= pFStack_18->WeightMin) && ((uVar1 != 0 || (pFStack_18->fUse0 == 0))))
        break;
        Fxu_UpdateSingle((Fxu_Matrix *)pSingle);
        iVar2 = pFStack_18->nNodesNew + 1;
        pFStack_18->nNodesNew = iVar2;
      } while (iVar2 < pFStack_18->nNodesExt);
    }
    if (pFStack_18->fVerbose != 0) {
      printf("Total single = %3d. Total double = %3d. Total compl = %3d.                    \n",
             (ulong)*(uint *)((long)&pSingle[3].pNext + 4),(ulong)(uint)pSingle[4].Num,
             (ulong)(uint)pSingle[4].HNum);
    }
    if (pFStack_18->nNodesNew != 0) {
      Fxu_CreateCovers((Fxu_Matrix *)pSingle,pFStack_18);
    }
    Fxu_MatrixDelete((Fxu_Matrix *)pSingle);
    if (pFStack_18->nNodesNew == pFStack_18->nNodesExt) {
      printf("Warning: The limit on the number of extracted divisors has been reached.\n");
    }
    pData_local._4_4_ = pFStack_18->nNodesNew;
  }
  return pData_local._4_4_;
}

Assistant:

int Fxu_FastExtract( Fxu_Data_t * pData )
{
    int fScrollLines = 0;
    Fxu_Matrix * p;
    Fxu_Single * pSingle;
    Fxu_Double * pDouble;
    int Weight1, Weight2, Weight3;
    int Counter = 0;

    s_MemoryTotal = 0;
    s_MemoryPeak  = 0;

    // create the matrix
    p = Fxu_CreateMatrix( pData );
    if ( p == NULL )
        return -1;
//    if ( pData->fVerbose )
//        printf( "Memory usage after construction: Total = %d. Peak = %d.\n", s_MemoryTotal, s_MemoryPeak );
//Fxu_MatrixPrint( NULL, p );

    if ( pData->fOnlyS )
    {
        pData->nNodesNew = 0;
        do
        {
            Weight1 = Fxu_HeapSingleReadMaxWeight( p->pHeapSingle );
            if ( pData->fVerbose )
                printf( "Div %5d : Best single = %5d.%s", Counter++, Weight1, fScrollLines?"\n":"\r" );
            if ( Weight1 > pData->WeightMin || (Weight1 == 0 && pData->fUse0) )
                Fxu_UpdateSingle( p );
            else
                break;
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }
    else if ( pData->fOnlyD )
    {
        pData->nNodesNew = 0;
        do
        {
            Weight2 = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );
            if ( pData->fVerbose )
                printf( "Div %5d : Best double = %5d.%s", Counter++, Weight2, fScrollLines?"\n":"\r" );
            if ( Weight2 > pData->WeightMin || (Weight2 == 0 && pData->fUse0) )
                Fxu_UpdateDouble( p );
            else
                break;
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }
    else if ( !pData->fUseCompl )
    {
        pData->nNodesNew = 0;
        do
        {
            Weight1 = Fxu_HeapSingleReadMaxWeight( p->pHeapSingle );
            Weight2 = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );

            if ( pData->fVerbose )
                printf( "Div %5d : Best double = %5d. Best single = %5d.%s", Counter++, Weight2, Weight1, fScrollLines?"\n":"\r" );
//Fxu_Select( p, &pSingle, &pDouble );

            if ( Weight1 >= Weight2 )
            {
                if ( Weight1 > pData->WeightMin || (Weight1 == 0 && pData->fUse0) )
                    Fxu_UpdateSingle( p );
                else
                    break;
            }
            else
            {
                if ( Weight2 > pData->WeightMin || (Weight2 == 0 && pData->fUse0) )
                    Fxu_UpdateDouble( p );
                else
                    break;
            }
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }
    else
    { // use the complement
        pData->nNodesNew = 0;
        do
        {
            Weight1 = Fxu_HeapSingleReadMaxWeight( p->pHeapSingle );
            Weight2 = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );

            // select the best single and double
            Weight3 = Fxu_Select( p, &pSingle, &pDouble );
            if ( pData->fVerbose )
                printf( "Div %5d : Best double = %5d. Best single = %5d. Best complement = %5d.%s", 
                    Counter++, Weight2, Weight1, Weight3, fScrollLines?"\n":"\r" );

            if ( Weight3 > pData->WeightMin || (Weight3 == 0 && pData->fUse0) )
                Fxu_Update( p, pSingle, pDouble );
            else
                break;
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }

    if ( pData->fVerbose )
        printf( "Total single = %3d. Total double = %3d. Total compl = %3d.                    \n", 
        p->nDivs1, p->nDivs2, p->nDivs3 );

    // create the new covers
    if ( pData->nNodesNew )
        Fxu_CreateCovers( p, pData );
    Fxu_MatrixDelete( p );
//    printf( "Memory usage after deallocation:   Total = %d. Peak = %d.\n", s_MemoryTotal, s_MemoryPeak );
    if ( pData->nNodesNew == pData->nNodesExt )
        printf( "Warning: The limit on the number of extracted divisors has been reached.\n" );
    return pData->nNodesNew;
}